

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

uint get_input_line(char **string,uint option)

{
  char cVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  __s = vrna_read_line(_stdin);
  uVar7 = 1;
  if (__s != (char *)0x0) {
    if ((char)option < '\0') {
      cVar1 = *__s;
LAB_001239a8:
      if (cVar1 == '@') {
        free(__s);
        uVar7 = 2;
      }
      else {
        if ((option >> 8 & 1) == 0) {
          sVar3 = strlen(__s);
          for (uVar6 = sVar3 & 0xffffffff;
              (uVar5 = (int)(uint)sVar3 >> 0x1f & (uint)sVar3, 0 < (int)(uint)uVar6 &&
              ((__s[uVar6 - 1] == ' ' || (uVar5 = (uint)uVar6, __s[uVar6 - 1] == '\t'))));
              uVar6 = uVar6 - 1) {
          }
          uVar6 = 0;
          if (0 < (int)uVar5) {
            uVar6 = (ulong)uVar5;
          }
          __s[uVar6] = '\0';
          cVar1 = *__s;
        }
        if (cVar1 == '>') {
          sVar3 = strlen(__s);
          pcVar4 = (char *)vrna_alloc((int)sVar3 + 1);
          *string = pcVar4;
          iVar2 = __isoc99_sscanf(__s,">%s",pcVar4);
          if (iVar2 < 1) {
            free(__s);
            free(*string);
            *string = (char *)0x0;
          }
          else {
            pcVar4 = *string;
            sVar3 = strlen(pcVar4);
            pcVar4 = (char *)vrna_realloc(pcVar4,(int)sVar3 + 1);
            *string = pcVar4;
            free(__s);
            uVar7 = 8;
          }
        }
        else {
          pcVar4 = strdup(__s);
          *string = pcVar4;
          free(__s);
          uVar7 = 4;
        }
      }
    }
    else {
      do {
        cVar1 = *__s;
        if ((cVar1 != '*') && (cVar1 != '\0')) goto LAB_001239a8;
        free(__s);
        __s = vrna_read_line(_stdin);
      } while (__s != (char *)0x0);
    }
  }
  return uVar7;
}

Assistant:

PUBLIC unsigned int
get_input_line(char         **string,
               unsigned int option)
{
  char  *line;
  int   i, l, r;

  /*
   * read lines until informative data appears or
   * report an error if anything goes wrong
   */
  if ((line = vrna_read_line(stdin)) == NULL)
    return VRNA_INPUT_ERROR;

  if (!(option & VRNA_INPUT_NOSKIP_COMMENTS)) {
    while ((*line == '*') || (*line == '\0')) {
      free(line);
      if ((line = vrna_read_line(stdin)) == NULL)
        return VRNA_INPUT_ERROR;
    }
  }

  l = (int)strlen(line);

  /* break on '@' sign if not disabled */
  if (*line == '@') {
    free(line);
    return VRNA_INPUT_QUIT;
  }

  /* print line read if not disabled */
  /* if(!(option & VRNA_INPUT_NOPRINT)) printf("%s\n", line); */

  /* eliminate whitespaces at the end of the line read */
  if (!(option & VRNA_INPUT_NO_TRUNCATION)) {
    for (i = l - 1; i >= 0; i--) {
      if (line[i] == ' ')
        continue;
      else if (line[i] == '\t')
        continue;
      else
        break;
    }
    line[(i >= 0) ? (i + 1) : 0] = '\0';
  }

  if (*line == '>') {
    /* fasta header */
    /* alloc memory for the string */
    *string = (char *)vrna_alloc(sizeof(char) * (strlen(line) + 1));
    r       = VRNA_INPUT_FASTA_HEADER;
    i       = sscanf(line, ">%s", *string);
    if (i > 0) {
      i       = (int)strlen(*string);
      *string = (char *)vrna_realloc(*string, (i + 1) * sizeof(char));
      free(line);
      return r;
    } else {
      free(line);
      free(*string);
      *string = NULL;
      return VRNA_INPUT_ERROR;
    }
  } else {
    *string = strdup(line);
    free(line);
  }

  return VRNA_INPUT_MISC;
}